

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O3

bool __thiscall wabt::WastLexer::ReadBlockComment(WastLexer *this)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  
  pcVar2 = this->buffer_end_;
  if (this->cursor_ < pcVar2) {
    iVar3 = this->line_;
    iVar4 = 1;
    pcVar5 = this->cursor_;
    do {
      pcVar6 = pcVar5 + 1;
      this->cursor_ = pcVar6;
      cVar1 = *pcVar5;
      if (cVar1 == '\n') {
        iVar3 = iVar3 + 1;
        this->line_ = iVar3;
        this->line_start_ = pcVar6;
      }
      else if (cVar1 == '(') {
        if ((pcVar6 < pcVar2) && (*pcVar6 == ';')) {
          pcVar6 = pcVar5 + 2;
          this->cursor_ = pcVar6;
          iVar4 = iVar4 + 1;
        }
      }
      else if (((cVar1 == ';') && (pcVar6 < pcVar2)) && (*pcVar6 == ')')) {
        pcVar6 = pcVar5 + 2;
        this->cursor_ = pcVar6;
        iVar4 = iVar4 + -1;
        if (iVar4 == 0) {
          return true;
        }
      }
      pcVar5 = pcVar6;
    } while (pcVar6 < pcVar2);
  }
  Error(this,0x1714c8);
  return false;
}

Assistant:

bool WastLexer::ReadBlockComment() {
  int nesting = 1;
  while (true) {
    switch (ReadChar()) {
      case kEof:
        ERROR("EOF in block comment");
        return false;

      case ';':
        if (MatchChar(')') && --nesting == 0) {
          return true;
        }
        break;

      case '(':
        if (MatchChar(';')) {
          nesting++;
        }
        break;

      case '\n':
        Newline();
        break;
    }
  }
}